

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayCloseDoesNotHaveSideEffectsWhenFailing::
TestCheckArrayCloseDoesNotHaveSideEffectsWhenFailing
          (TestCheckArrayCloseDoesNotHaveSideEffectsWhenFailing *this)

{
  char *suiteName;
  TestCheckArrayCloseDoesNotHaveSideEffectsWhenFailing *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckArrayCloseDoesNotHaveSideEffectsWhenFailing",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x25a);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestCheckArrayCloseDoesNotHaveSideEffectsWhenFailing_00183540;
  return;
}

Assistant:

TEST(CheckArrayCloseDoesNotHaveSideEffectsWhenFailing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);

		const float data[] = { 0, 1, 3, 3 };
        CHECK_ARRAY_CLOSE (data, FunctionWithSideEffects2(), 4, 0.01f);
    }

	CHECK_EQUAL(1, g_sideEffect);
}